

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexPointFilter::eval
          (PtexPointFilter *this,float *result,int firstchan,int nchannels,int faceid,float u,
          float v,float param_7,float param_8,float param_9,float param_10,float param_11,
          float param_12)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (((-1 < faceid) && (0 < nchannels)) && (this->_tx != (PtexTexture *)0x0)) {
    iVar1 = (*this->_tx->_vptr_PtexTexture[0xc])();
    if (faceid < iVar1) {
      iVar1 = (*this->_tx->_vptr_PtexTexture[0x10])(this->_tx,faceid);
      iVar5 = 1 << (*(byte *)CONCAT44(extraout_var,iVar1) & 0x1f);
      iVar1 = 1 << (((byte *)CONCAT44(extraout_var,iVar1))[1] & 0x1f);
      uVar3 = (uint)((float)iVar5 * u);
      uVar6 = iVar5 - 1;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      if ((int)uVar6 <= (int)uVar3) {
        uVar3 = uVar6;
      }
      uVar2 = (uint)((float)iVar1 * v);
      uVar4 = iVar1 - 1;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = uVar2;
      }
      if ((int)uVar4 <= (int)uVar6) {
        uVar6 = uVar4;
      }
      (*this->_tx->_vptr_PtexTexture[0x15])
                (this->_tx,faceid,(ulong)uVar3,(ulong)uVar6,result,(ulong)(uint)firstchan,nchannels)
      ;
    }
  }
  return;
}

Assistant:

virtual void eval(float* result, int firstchan, int nchannels,
                      int faceid, float u, float v,
                      float /*uw1*/, float /*vw1*/, float /*uw2*/, float /*vw2*/,
                      float /*width*/, float /*blur*/)
    {
        if (!_tx || nchannels <= 0) return;
        if (faceid < 0 || faceid >= _tx->numFaces()) return;
        const FaceInfo& f = _tx->getFaceInfo(faceid);
        int resu = f.res.u(), resv = f.res.v();
        int ui = PtexUtils::clamp(int(u*(float)resu), 0, resu-1);
        int vi = PtexUtils::clamp(int(v*(float)resv), 0, resv-1);
        _tx->getPixel(faceid, ui, vi, result, firstchan, nchannels);
    }